

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3EvalDlPhraseNext(Fts3Table *pTab,Fts3Doclist *pDL,u8 *pbEof)

{
  long lVar1;
  int iVar2;
  char **ppPoslist;
  char **in_RDX;
  long *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  bool bVar3;
  char *pEnd;
  sqlite3_int64 iDelta;
  char *pIter;
  sqlite_int64 *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  char **local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI[2] == 0) {
    local_10 = (char **)*in_RSI;
  }
  else {
    local_10 = (char **)in_RSI[2];
  }
  if ((local_10 == (char **)0x0) ||
     (ppPoslist = (char **)(*in_RSI + (long)(int)in_RSI[1]), ppPoslist <= local_10)) {
    *(undefined1 *)in_RDX = 1;
  }
  else {
    iVar2 = sqlite3Fts3GetVarint
                      ((char *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffb8);
    local_10 = (char **)((long)local_10 + (long)iVar2);
    if ((*(char *)(in_RDI + 0x1cf) == '\0') || (in_RSI[2] == 0)) {
      in_RSI[3] = (long)(&DAT_aaaaaaaaaaaaaaaa + in_RSI[3]);
    }
    else {
      in_RSI[3] = in_RSI[3] + 0x5555555555555556;
    }
    in_RSI[5] = (long)local_10;
    fts3PoslistCopy(in_RDX,ppPoslist);
    *(int *)(in_RSI + 6) = (int)local_10 - (int)in_RSI[5];
    while( true ) {
      bVar3 = false;
      if (local_10 < ppPoslist) {
        bVar3 = *(char *)local_10 == '\0';
      }
      if (!bVar3) break;
      local_10 = (char **)((long)local_10 + 1);
    }
    in_RSI[2] = (long)local_10;
    *(undefined1 *)in_RDX = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void fts3EvalDlPhraseNext(
  Fts3Table *pTab,
  Fts3Doclist *pDL,
  u8 *pbEof
){
  char *pIter;                            /* Used to iterate through aAll */
  char *pEnd;                             /* 1 byte past end of aAll */

  if( pDL->pNextDocid ){
    pIter = pDL->pNextDocid;
    assert( pDL->aAll!=0 || pIter==0 );
  }else{
    pIter = pDL->aAll;
  }

  if( pIter==0 || pIter>=(pEnd = pDL->aAll + pDL->nAll) ){
    /* We have already reached the end of this doclist. EOF. */
    *pbEof = 1;
  }else{
    sqlite3_int64 iDelta;
    pIter += sqlite3Fts3GetVarint(pIter, &iDelta);
    if( pTab->bDescIdx==0 || pDL->pNextDocid==0 ){
      pDL->iDocid += iDelta;
    }else{
      pDL->iDocid -= iDelta;
    }
    pDL->pList = pIter;
    fts3PoslistCopy(0, &pIter);
    pDL->nList = (int)(pIter - pDL->pList);

    /* pIter now points just past the 0x00 that terminates the position-
    ** list for document pDL->iDocid. However, if this position-list was
    ** edited in place by fts3EvalNearTrim(), then pIter may not actually
    ** point to the start of the next docid value. The following line deals
    ** with this case by advancing pIter past the zero-padding added by
    ** fts3EvalNearTrim().  */
    while( pIter<pEnd && *pIter==0 ) pIter++;

    pDL->pNextDocid = pIter;
    assert( pIter>=&pDL->aAll[pDL->nAll] || *pIter );
    *pbEof = 0;
  }
}